

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BEREncode.cpp
# Opt level: O0

int __thiscall OctetType::serialise(OctetType *this,uint8_t *buf,size_t max_len)

{
  int iVar1;
  size_t known_length;
  void *__src;
  size_t __n;
  uint8_t *ptr;
  int i;
  size_t max_len_local;
  uint8_t *buf_local;
  OctetType *this_local;
  
  known_length = std::__cxx11::string::length();
  this_local._4_4_ = BER_CONTAINER::serialise(&this->super_BER_CONTAINER,buf,max_len,known_length);
  if (-1 < this_local._4_4_) {
    __src = (void *)std::__cxx11::string::data();
    __n = std::__cxx11::string::length();
    memcpy(buf + this_local._4_4_,__src,__n);
    iVar1 = std::__cxx11::string::length();
    this_local._4_4_ = (iVar1 + (int)(buf + this_local._4_4_)) - (int)buf;
  }
  return this_local._4_4_;
}

Assistant:

int OctetType::serialise(uint8_t* buf, size_t max_len){
    int i = BER_CONTAINER::serialise(buf, max_len, _value.length());
    CHECK_ENCODE_ERR(i);
    uint8_t *ptr = buf + i;

    memcpy(ptr, _value.data(), _value.length());
    ptr += _value.length();

    return ptr - buf;
}